

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall
ezc3d::c3d::setGroupMetadata(c3d *this,string *groupName,string *description,bool isLocked)

{
  Group *pGVar1;
  byte in_CL;
  size_t in_RDI;
  Parameters *unaff_retaddr;
  invalid_argument *anon_var_0;
  size_t idx;
  string *in_stack_ffffffffffffff08;
  Group *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff58;
  Parameters *in_stack_ffffffffffffff60;
  
  parameters((c3d *)0x14b9ec);
  ParametersNS::Parameters::groupIdx(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  __shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x14bb23);
  ParametersNS::Parameters::group(unaff_retaddr,in_RDI);
  ParametersNS::GroupNS::Group::description(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((in_CL & 1) == 0) {
    std::
    __shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x14bc0d);
    pGVar1 = ParametersNS::Parameters::group(unaff_retaddr,in_RDI);
    ParametersNS::GroupNS::Group::unlock(pGVar1);
  }
  else {
    std::
    __shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x14bb62);
    pGVar1 = ParametersNS::Parameters::group(unaff_retaddr,in_RDI);
    ParametersNS::GroupNS::Group::lock(pGVar1);
  }
  return;
}

Assistant:

void ezc3d::c3d::setGroupMetadata(const std::string &groupName,
                                  const std::string &description,
                                  bool isLocked) {
  size_t idx;
  try {
    idx = parameters().groupIdx(groupName);
  } catch (const std::invalid_argument&) {
    _parameters->group(ezc3d::ParametersNS::GroupNS::Group(groupName));
    idx = parameters().groupIdx(groupName);
  }

  _parameters->group(idx).description(description);
  if (isLocked) {
    _parameters->group(idx).lock();
  } else {
    _parameters->group(idx).unlock();
  }
}